

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetSetter
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          JavascriptString *propertyNameString,Var *setterValue,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<int> *local_58;
  DictionaryPropertyDescriptor<int> *descriptor;
  CharacterBuffer<char16_t> propertyName;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  JavascriptString *propertyNameString_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  propertyName._8_8_ = requestContext;
  pcVar4 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(pcVar4,cVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ba,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pcVar4 = JavascriptString::GetString(propertyNameString);
  cVar3 = JavascriptString::GetLength(propertyNameString);
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
            ((CharacterBuffer<char16_t> *)&descriptor,pcVar4,cVar3);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,(CharacterBuffer<char16_t> *)&descriptor,&local_58);
  if (bVar2) {
    this_local._4_4_ = GetSetterFromDescriptor<false>(this,instance,local_58,setterValue,info);
  }
  else {
    this_local._4_4_ = None;
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        DictionaryPropertyDescriptor<T>* descriptor;

        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            return GetSetterFromDescriptor<false>(instance, descriptor, setterValue, info);
        }

        return None;
    }